

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

bool icu_63::number::impl::GeneratorHelpers::notation
               (MacroProps *macros,UnicodeString *sb,UErrorCode *status)

{
  UBool UVar1;
  ConstChar16Ptr local_68;
  ConstChar16Ptr local_60;
  NotationUnion *local_58;
  ScientificSettings *impl;
  ConstChar16Ptr local_38;
  UNumberCompactStyle local_2c;
  UErrorCode *pUStack_28;
  UNumberCompactStyle style;
  UErrorCode *status_local;
  UnicodeString *sb_local;
  MacroProps *macros_local;
  
  pUStack_28 = status;
  status_local = (UErrorCode *)sb;
  sb_local = (UnicodeString *)macros;
  if ((macros->notation).fType == NTN_COMPACT) {
    local_2c = (macros->notation).fUnion.compactStyle;
    if (local_2c == UNUM_LONG) {
      ConstChar16Ptr::ConstChar16Ptr(&local_38,L"compact-long");
      UnicodeString::append(sb,&local_38,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_38);
      macros_local._7_1_ = true;
    }
    else if (local_2c == UNUM_SHORT) {
      ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&impl,L"compact-short");
      UnicodeString::append(sb,(ConstChar16Ptr *)&impl,-1);
      ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&impl);
      macros_local._7_1_ = true;
    }
    else {
      *status = U_UNSUPPORTED_ERROR;
      macros_local._7_1_ = false;
    }
  }
  else if ((macros->notation).fType == NTN_SCIENTIFIC) {
    local_58 = &(macros->notation).fUnion;
    if ((local_58->scientific).fEngineeringInterval == '\x03') {
      ConstChar16Ptr::ConstChar16Ptr(&local_60,L"engineering");
      UnicodeString::append(sb,&local_60,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_60);
    }
    else {
      ConstChar16Ptr::ConstChar16Ptr(&local_68,L"scientific");
      UnicodeString::append(sb,&local_68,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_68);
    }
    if (1 < (local_58->scientific).fMinExponentDigits) {
      UnicodeString::append((UnicodeString *)status_local,L'/');
      blueprint_helpers::generateExponentWidthOption
                ((int)(local_58->scientific).fMinExponentDigits,(UnicodeString *)status_local,
                 pUStack_28);
      UVar1 = ::U_FAILURE(*pUStack_28);
      if (UVar1 != '\0') {
        return false;
      }
    }
    if ((local_58->scientific).fExponentSignDisplay != UNUM_SIGN_AUTO) {
      UnicodeString::append((UnicodeString *)status_local,L'/');
      enum_to_stem_string::signDisplay
                ((local_58->scientific).fExponentSignDisplay,(UnicodeString *)status_local);
    }
    macros_local._7_1_ = true;
  }
  else {
    macros_local._7_1_ = false;
  }
  return macros_local._7_1_;
}

Assistant:

bool GeneratorHelpers::notation(const MacroProps& macros, UnicodeString& sb, UErrorCode& status) {
    if (macros.notation.fType == Notation::NTN_COMPACT) {
        UNumberCompactStyle style = macros.notation.fUnion.compactStyle;
        if (style == UNumberCompactStyle::UNUM_LONG) {
            sb.append(u"compact-long", -1);
            return true;
        } else if (style == UNumberCompactStyle::UNUM_SHORT) {
            sb.append(u"compact-short", -1);
            return true;
        } else {
            // Compact notation generated from custom data (not supported in skeleton)
            // The other compact notations are literals
            status = U_UNSUPPORTED_ERROR;
            return false;
        }
    } else if (macros.notation.fType == Notation::NTN_SCIENTIFIC) {
        const Notation::ScientificSettings& impl = macros.notation.fUnion.scientific;
        if (impl.fEngineeringInterval == 3) {
            sb.append(u"engineering", -1);
        } else {
            sb.append(u"scientific", -1);
        }
        if (impl.fMinExponentDigits > 1) {
            sb.append(u'/');
            blueprint_helpers::generateExponentWidthOption(impl.fMinExponentDigits, sb, status);
            if (U_FAILURE(status)) {
                return false;
            }
        }
        if (impl.fExponentSignDisplay != UNUM_SIGN_AUTO) {
            sb.append(u'/');
            enum_to_stem_string::signDisplay(impl.fExponentSignDisplay, sb);
        }
        return true;
    } else {
        // Default value is not shown in normalized form
        return false;
    }
}